

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O3

econf_err setBoolValueNum(econf_file *kf,size_t num,void *v)

{
  char *string;
  char *string_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  econf_err eVar4;
  char *pcVar5;
  
  pcVar5 = "_none_";
  if (v != (void *)0x0) {
    pcVar5 = (char *)v;
  }
  string = strdup(pcVar5);
  string_00 = toLowerCase(string);
  sVar1 = hashstring(string_00);
  if (*pcVar5 == '1') {
    sVar2 = strlen(string);
    if (sVar2 != 1) goto LAB_00106c22;
LAB_00106c44:
    free(kf->file_entry[num].value);
    pcVar5 = "true";
  }
  else {
LAB_00106c22:
    sVar3 = hashstring("yes");
    if (sVar1 == sVar3) goto LAB_00106c44;
    sVar3 = hashstring("true");
    if (sVar1 == sVar3) goto LAB_00106c44;
    if (*pcVar5 == '0') {
      sVar2 = strlen(string);
      if (sVar2 != 1) goto LAB_00106c9d;
LAB_00106cbf:
      free(kf->file_entry[num].value);
      pcVar5 = "false";
    }
    else {
LAB_00106c9d:
      sVar3 = hashstring("no");
      if (sVar1 == sVar3) goto LAB_00106cbf;
      sVar3 = hashstring("false");
      if (sVar1 == sVar3) goto LAB_00106cbf;
      sVar3 = hashstring("_none_");
      if ((sVar1 != sVar3) && (eVar4 = ECONF_WRONG_BOOLEAN_VALUE, *pcVar5 != '\0'))
      goto LAB_00106c6f;
      free(kf->file_entry[num].value);
      pcVar5 = "_none_";
    }
  }
  pcVar5 = strdup(pcVar5);
  kf->file_entry[num].value = pcVar5;
  eVar4 = ECONF_SUCCESS;
LAB_00106c6f:
  free(string);
  return eVar4;
}

Assistant:

econf_err setBoolValueNum(econf_file *kf, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : KEY_FILE_NULL_VALUE);
  econf_err error = ECONF_SUCCESS;
  char *tmp = strdup(value);
  size_t hash = hashstring(toLowerCase(tmp));

  if ((*value == '1' && strlen(tmp) == 1) || hash == YES || hash == TRUE) {
    free(kf->file_entry[num].value);
    kf->file_entry[num].value = strdup("true");
  } else if ((*value == '0' && strlen(tmp) == 1) ||
             hash == NO || hash == FALSE) {
    free(kf->file_entry[num].value);
    kf->file_entry[num].value = strdup("false");
  } else if (hash == KEY_FILE_NULL_VALUE_HASH || strlen(value) == 0) {
    free(kf->file_entry[num].value);
    kf->file_entry[num].value = strdup(KEY_FILE_NULL_VALUE);
  } else { error = ECONF_WRONG_BOOLEAN_VALUE; }

  free(tmp);
  return error;
}